

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
kj::_::TupleImpl<kj::_::Indexes<0ul,1ul>,kj::Maybe<char>,kj::Array<char>>::
TupleImpl<kj::Maybe<char>,kj::Array<char>>
          (TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Maybe<char>,_kj::Array<char>_> *this,
          Maybe<char> *params,Array<char> *params_1)

{
  byte bVar1;
  
  bVar1 = (params->ptr).isSet;
  (this->super_TupleElement<0U,_kj::Maybe<char>_>).value.ptr.isSet = (bool)bVar1;
  if ((bool)bVar1 == true) {
    (this->super_TupleElement<0U,_kj::Maybe<char>_>).value.ptr.field_1 = (params->ptr).field_1;
    bVar1 = (params->ptr).isSet;
  }
  if ((bVar1 & 1) != 0) {
    (params->ptr).isSet = false;
  }
  (this->super_TupleElement<1U,_kj::Array<char>_>).value.ptr = params_1->ptr;
  (this->super_TupleElement<1U,_kj::Array<char>_>).value.size_ = params_1->size_;
  (this->super_TupleElement<1U,_kj::Array<char>_>).value.disposer = params_1->disposer;
  params_1->ptr = (char *)0x0;
  params_1->size_ = 0;
  return;
}

Assistant:

inline NullableValue(NullableValue&& other)
      : isSet(other.isSet) {
    if (isSet) {
      ctor(value, kj::mv(other.value));
    }
  }